

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

void parserInit(XML_Parser parser,XML_Char *encodingName)

{
  char *pcVar1;
  XML_Char *__dest;
  unsigned_long uVar2;
  ENCODING **encPtr;
  size_t charsRequired;
  size_t __n;
  
  parser->m_processor = prologInitProcessor;
  coda_XmlPrologStateInit(&parser->m_prologState);
  if (encodingName != (XML_Char *)0x0) {
    __n = 0;
    do {
      pcVar1 = encodingName + __n;
      __n = __n + 1;
    } while (*pcVar1 != '\0');
    __dest = (XML_Char *)(*(parser->m_mem).malloc_fcn)(__n);
    if (__dest == (XML_Char *)0x0) {
      __dest = (XML_Char *)0x0;
    }
    else {
      memcpy(__dest,encodingName,__n);
    }
    parser->m_protocolEncodingName = __dest;
  }
  parser->m_curBase = (XML_Char *)0x0;
  encPtr = &parser->m_encoding;
  coda_XmlInitEncoding(&parser->m_initEncoding,encPtr,(char *)0x0);
  parser->m_userData = (void *)0x0;
  parser->m_handlerArg = (void *)0x0;
  parser->m_startElementHandler = (XML_StartElementHandler)0x0;
  parser->m_endElementHandler = (XML_EndElementHandler)0x0;
  parser->m_characterDataHandler = (XML_CharacterDataHandler)0x0;
  parser->m_processingInstructionHandler = (XML_ProcessingInstructionHandler)0x0;
  parser->m_commentHandler = (XML_CommentHandler)0x0;
  parser->m_startCdataSectionHandler = (XML_StartCdataSectionHandler)0x0;
  parser->m_endCdataSectionHandler = (XML_EndCdataSectionHandler)0x0;
  parser->m_defaultHandler = (XML_DefaultHandler)0x0;
  parser->m_startDoctypeDeclHandler = (XML_StartDoctypeDeclHandler)0x0;
  parser->m_endDoctypeDeclHandler = (XML_EndDoctypeDeclHandler)0x0;
  parser->m_unparsedEntityDeclHandler = (XML_UnparsedEntityDeclHandler)0x0;
  parser->m_notationDeclHandler = (XML_NotationDeclHandler)0x0;
  parser->m_startNamespaceDeclHandler = (XML_StartNamespaceDeclHandler)0x0;
  parser->m_endNamespaceDeclHandler = (XML_EndNamespaceDeclHandler)0x0;
  parser->m_notStandaloneHandler = (XML_NotStandaloneHandler)0x0;
  parser->m_externalEntityRefHandler = (XML_ExternalEntityRefHandler)0x0;
  parser->m_externalEntityRefHandlerArg = parser;
  parser->m_skippedEntityHandler = (XML_SkippedEntityHandler)0x0;
  parser->m_elementDeclHandler = (XML_ElementDeclHandler)0x0;
  parser->m_attlistDeclHandler = (XML_AttlistDeclHandler)0x0;
  parser->m_entityDeclHandler = (XML_EntityDeclHandler)0x0;
  parser->m_xmlDeclHandler = (XML_XmlDeclHandler)0x0;
  parser->m_bufferPtr = parser->m_buffer;
  parser->m_bufferEnd = parser->m_buffer;
  parser->m_parseEndByteIndex = 0;
  parser->m_parseEndPtr = (char *)0x0;
  parser->m_partialTokenBytesBefore = 0;
  parser->m_reparseDeferralEnabled = '\x01';
  parser->m_lastBufferRequestSize = 0;
  (parser->m_position).lineNumber = 0;
  (parser->m_position).columnNumber = 0;
  parser->m_errorCode = XML_ERROR_NONE;
  parser->m_positionPtr = (char *)0x0;
  parser->m_openInternalEntities = (OPEN_INTERNAL_ENTITY *)0x0;
  parser->m_eventPtr = (char *)0x0;
  parser->m_eventEndPtr = (char *)0x0;
  *(undefined8 *)((long)&parser->m_declElementType + 2) = 0;
  *(undefined8 *)((long)&parser->m_declAttributeId + 2) = 0;
  parser->m_declNotationPublicId = (XML_Char *)0x0;
  parser->m_declElementType = (ELEMENT_TYPE *)0x0;
  parser->m_declAttributeType = (XML_Char *)0x0;
  parser->m_declNotationName = (XML_Char *)0x0;
  parser->m_doctypeSysid = (XML_Char *)0x0;
  parser->m_doctypePubid = (XML_Char *)0x0;
  parser->m_declEntity = (ENTITY *)0x0;
  parser->m_doctypeName = (XML_Char *)0x0;
  parser->m_defaultExpandInternalEntities = '\x01';
  parser->m_tagLevel = 0;
  parser->m_tagStack = (TAG *)0x0;
  parser->m_inheritedBindings = (BINDING *)0x0;
  parser->m_nSpecifiedAtts = 0;
  parser->m_unknownEncodingRelease = (_func_void_void_ptr *)0x0;
  parser->m_parentParser = (XML_Parser)0x0;
  (parser->m_parsingStatus).parsing = XML_INITIALIZED;
  parser->m_isParamEntity = '\0';
  parser->m_useForeignDTD = '\0';
  parser->m_unknownEncodingMem = (void *)0x0;
  parser->m_unknownEncodingData = (void *)0x0;
  *(undefined4 *)((long)&(parser->m_accounting).activationThresholdBytes + 4) = 0;
  *(undefined8 *)((long)&(parser->m_accounting).debugLevel + 4) = 0;
  *(undefined8 *)&(parser->m_accounting).field_0x1c = 0;
  *(undefined8 *)((long)&(parser->m_accounting).countBytesDirect + 4) = 0;
  *(undefined8 *)((long)&(parser->m_accounting).countBytesIndirect + 4) = 0;
  *(undefined8 *)&parser->m_paramEntityParsing = 0;
  *(undefined8 *)((long)&parser->m_hash_secret_salt + 4) = 0;
  uVar2 = getDebugLevel("EXPAT_ACCOUNTING_DEBUG",(unsigned_long)encPtr);
  (parser->m_accounting).debugLevel = uVar2;
  (parser->m_accounting).maximumAmplificationFactor = 100.0;
  (parser->m_accounting).activationThresholdBytes = 0x800000;
  (parser->m_entity_stats).countEverOpened = 0;
  (parser->m_entity_stats).currentDepth = 0;
  *(undefined8 *)&(parser->m_entity_stats).maximumDepthSeen = 0;
  (parser->m_entity_stats).debugLevel = 0;
  uVar2 = getDebugLevel("EXPAT_ENTITY_DEBUG",(unsigned_long)encPtr);
  (parser->m_entity_stats).debugLevel = uVar2;
  return;
}

Assistant:

static void
parserInit(XML_Parser parser, const XML_Char *encodingName) {
  parser->m_processor = prologInitProcessor;
  XmlPrologStateInit(&parser->m_prologState);
  if (encodingName != NULL) {
    parser->m_protocolEncodingName = copyString(encodingName, &(parser->m_mem));
  }
  parser->m_curBase = NULL;
  XmlInitEncoding(&parser->m_initEncoding, &parser->m_encoding, 0);
  parser->m_userData = NULL;
  parser->m_handlerArg = NULL;
  parser->m_startElementHandler = NULL;
  parser->m_endElementHandler = NULL;
  parser->m_characterDataHandler = NULL;
  parser->m_processingInstructionHandler = NULL;
  parser->m_commentHandler = NULL;
  parser->m_startCdataSectionHandler = NULL;
  parser->m_endCdataSectionHandler = NULL;
  parser->m_defaultHandler = NULL;
  parser->m_startDoctypeDeclHandler = NULL;
  parser->m_endDoctypeDeclHandler = NULL;
  parser->m_unparsedEntityDeclHandler = NULL;
  parser->m_notationDeclHandler = NULL;
  parser->m_startNamespaceDeclHandler = NULL;
  parser->m_endNamespaceDeclHandler = NULL;
  parser->m_notStandaloneHandler = NULL;
  parser->m_externalEntityRefHandler = NULL;
  parser->m_externalEntityRefHandlerArg = parser;
  parser->m_skippedEntityHandler = NULL;
  parser->m_elementDeclHandler = NULL;
  parser->m_attlistDeclHandler = NULL;
  parser->m_entityDeclHandler = NULL;
  parser->m_xmlDeclHandler = NULL;
  parser->m_bufferPtr = parser->m_buffer;
  parser->m_bufferEnd = parser->m_buffer;
  parser->m_parseEndByteIndex = 0;
  parser->m_parseEndPtr = NULL;
  parser->m_partialTokenBytesBefore = 0;
  parser->m_reparseDeferralEnabled = g_reparseDeferralEnabledDefault;
  parser->m_lastBufferRequestSize = 0;
  parser->m_declElementType = NULL;
  parser->m_declAttributeId = NULL;
  parser->m_declEntity = NULL;
  parser->m_doctypeName = NULL;
  parser->m_doctypeSysid = NULL;
  parser->m_doctypePubid = NULL;
  parser->m_declAttributeType = NULL;
  parser->m_declNotationName = NULL;
  parser->m_declNotationPublicId = NULL;
  parser->m_declAttributeIsCdata = XML_FALSE;
  parser->m_declAttributeIsId = XML_FALSE;
  memset(&parser->m_position, 0, sizeof(POSITION));
  parser->m_errorCode = XML_ERROR_NONE;
  parser->m_eventPtr = NULL;
  parser->m_eventEndPtr = NULL;
  parser->m_positionPtr = NULL;
  parser->m_openInternalEntities = NULL;
  parser->m_defaultExpandInternalEntities = XML_TRUE;
  parser->m_tagLevel = 0;
  parser->m_tagStack = NULL;
  parser->m_inheritedBindings = NULL;
  parser->m_nSpecifiedAtts = 0;
  parser->m_unknownEncodingMem = NULL;
  parser->m_unknownEncodingRelease = NULL;
  parser->m_unknownEncodingData = NULL;
  parser->m_parentParser = NULL;
  parser->m_parsingStatus.parsing = XML_INITIALIZED;
#ifdef XML_DTD
  parser->m_isParamEntity = XML_FALSE;
  parser->m_useForeignDTD = XML_FALSE;
  parser->m_paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
#endif
  parser->m_hash_secret_salt = 0;

#if XML_GE == 1
  memset(&parser->m_accounting, 0, sizeof(ACCOUNTING));
  parser->m_accounting.debugLevel = getDebugLevel("EXPAT_ACCOUNTING_DEBUG", 0u);
  parser->m_accounting.maximumAmplificationFactor
      = EXPAT_BILLION_LAUGHS_ATTACK_PROTECTION_MAXIMUM_AMPLIFICATION_DEFAULT;
  parser->m_accounting.activationThresholdBytes
      = EXPAT_BILLION_LAUGHS_ATTACK_PROTECTION_ACTIVATION_THRESHOLD_DEFAULT;

  memset(&parser->m_entity_stats, 0, sizeof(ENTITY_STATS));
  parser->m_entity_stats.debugLevel = getDebugLevel("EXPAT_ENTITY_DEBUG", 0u);
#endif
}